

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall upb::generator::Output::operator()(Output *this,string_view format,char **arg)

{
  char *__s;
  string_view data;
  string result;
  char *local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  size_t local_38;
  char *local_30;
  
  __s = *arg;
  if (__s == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = strlen(__s);
  }
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  local_30 = __s;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (&local_58,format._M_len,format._M_str,&local_38,1);
  data._M_str = local_58;
  data._M_len = local_50;
  Write(this,data);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }